

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall
server_context::send_partial_response
          (server_context *this,server_slot *slot,completion_token_output *tkn)

{
  size_t in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  long **pplVar1;
  long *plVar2;
  int in_R8D;
  byte bVar3;
  long *local_70;
  long *local_68 [9];
  
  bVar3 = 0;
  httplib::detail::std::make_unique<server_task_result_cmpl_partial>();
  *(int *)(local_70 + 1) = slot->id_task;
  *(int *)(local_70 + 2) = (int)slot->index;
  std::__cxx11::string::_M_assign((string *)(local_70 + 3));
  local_68[0] = (long *)CONCAT44(local_68[0]._4_4_,tkn->tok);
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)(local_70 + 7),local_68);
  *(int32_t *)(local_70 + 10) = slot->n_decoded;
  *(int32_t *)((long)local_70 + 0x54) = slot->n_prompt_tokens;
  *(bool *)(local_70 + 0xb) = (slot->params).post_sampling_probs;
  *(bool *)(local_70 + 0x1d) = (slot->params).verbose;
  *(oaicompat_type *)((long)local_70 + 0xec) = (slot->params).oaicompat;
  std::__cxx11::string::_M_assign((string *)(local_70 + 0x1e));
  std::__cxx11::string::_M_assign((string *)(local_70 + 0x22));
  __buf = extraout_RDX;
  if (0 < (slot->params).sampling.n_probs) {
    completion_token_output::operator=((completion_token_output *)(local_70 + 0xc),tkn);
    __buf = extraout_RDX_00;
  }
  if ((slot->stop != STOP_TYPE_NONE) || ((slot->params).timings_per_token != false)) {
    server_slot::get_timings(slot);
    pplVar1 = local_68;
    plVar2 = local_70 + 0x14;
    for (in_RCX = 9; __buf = extraout_RDX_01, in_RCX != 0; in_RCX = in_RCX - 1) {
      *plVar2 = (long)*pplVar1;
      pplVar1 = pplVar1 + (ulong)bVar3 * -2 + 1;
      plVar2 = plVar2 + (ulong)bVar3 * -2 + 1;
    }
  }
  local_68[0] = local_70;
  server_response::send(&this->queue_results,(int)local_68,__buf,in_RCX,in_R8D);
  if (local_68[0] != (long *)0x0) {
    (**(code **)(*local_68[0] + 0x28))();
  }
  return;
}

Assistant:

void send_partial_response(server_slot & slot, const completion_token_output & tkn) {
        auto res = std::make_unique<server_task_result_cmpl_partial>();

        res->id      = slot.id_task;
        res->index   = slot.index;
        res->content = tkn.text_to_send;
        res->tokens  = { tkn.tok };

        res->n_decoded           = slot.n_decoded;
        res->n_prompt_tokens     = slot.n_prompt_tokens;
        res->post_sampling_probs = slot.params.post_sampling_probs;

        res->verbose           = slot.params.verbose;
        res->oaicompat         = slot.params.oaicompat;
        res->oaicompat_model   = slot.params.oaicompat_model;
        res->oaicompat_cmpl_id = slot.params.oaicompat_cmpl_id;

        // populate res.probs_output
        if (slot.params.sampling.n_probs > 0) {
            res->prob_output = tkn; // copy the token probs
        }

        // populate timings if this is final response or timings_per_token is enabled
        if (slot.stop != STOP_TYPE_NONE || slot.params.timings_per_token) {
            res->timings = slot.get_timings();
        }

        queue_results.send(std::move(res));
    }